

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O2

void build_dindex_recursive<IsoHPlane>
               (size_t curr_node,size_t n_terminal,size_t ncomb,size_t st,size_t end,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *node_indices,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *node_mappings,
               vector<double,_std::allocator<double>_> *node_distances,
               vector<double,_std::allocator<double>_> *node_depths,size_t curr_depth,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *tree)

{
  pointer puVar1;
  pointer puVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pIVar6;
  unsigned_long uVar7;
  ulong uVar8;
  runtime_error *this;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  allocator<char> local_164;
  allocator<char> local_163;
  allocator<char> local_162;
  allocator<char> local_161;
  size_t local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_160 = curr_depth;
  local_158 = node_indices;
  while( true ) {
    sVar10 = st;
    if (st < end) {
      while (uVar8 = sVar10, uVar8 < end) {
        puVar1 = (local_158->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        puVar2 = (node_mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar3 = (node_distances->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar11 = uVar8 + 1; sVar10 = uVar8 + 1, uVar11 <= end; uVar11 = uVar11 + 1) {
          uVar4 = puVar2[puVar1[uVar8]];
          uVar5 = puVar2[puVar1[uVar11]];
          if (uVar4 < uVar5) {
            lVar9 = (ncomb - uVar4) + uVar5 +
                    ~(((n_terminal - uVar4) + -1) * (n_terminal - uVar4) >> 1);
          }
          else {
            lVar9 = ((uVar4 + ncomb) - uVar5) +
                    ~(((n_terminal - uVar5) + -1) * (n_terminal - uVar5) >> 1);
          }
          pdVar3[lVar9] = pdVar3[lVar9] + 1.0;
        }
      }
    }
    pIVar6 = (tree->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pIVar6[curr_node].hplane_left == 0) break;
    uVar8 = pIVar6[curr_node].hplane_right;
    puVar1 = (local_158->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar12 = st;
    for (sVar10 = st; sVar10 <= end; sVar10 = sVar10 + 1) {
      if (puVar1[sVar10] < uVar8) {
        uVar7 = puVar1[sVar12];
        puVar1[sVar12] = puVar1[sVar10];
        puVar1[sVar10] = uVar7;
        sVar12 = sVar12 + 1;
      }
    }
    if (sVar12 == st) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"Unexpected error in ",&local_161);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/indexer.cpp"
                 ,&local_162);
      std::operator+(&local_b0,&local_d0,&local_f0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,":",&local_163);
      std::operator+(&local_90,&local_b0,&local_110);
      std::__cxx11::to_string(&local_130,0xc9);
      std::operator+(&local_70,&local_90,&local_130);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,
                 ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                 ,&local_164);
      std::operator+(&local_50,&local_70,&local_150);
      std::runtime_error::runtime_error(this,(string *)&local_50);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_160 = local_160 + 1;
    build_dindex_recursive<IsoHPlane>
              (pIVar6[curr_node].hplane_left,n_terminal,ncomb,st,sVar12 - 1,local_158,node_mappings,
               node_distances,node_depths,local_160,tree);
    curr_node = (tree->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start[curr_node].hplane_right;
    st = sVar12;
  }
  (node_depths->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
  ._M_start[(node_mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start[curr_node]] =
       ((double)CONCAT44(0x45300000,(int)(local_160 >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)local_160) - 4503599627370496.0);
  return;
}

Assistant:

void build_dindex_recursive
(
    const size_t curr_node,
    const size_t n_terminal, const size_t ncomb,
    const size_t st, const size_t end,
    std::vector<size_t> &restrict node_indices, /* array with all terminal indices in 'tree' */
    const std::vector<size_t> &restrict node_mappings, /* tree_index : terminal_index */
    std::vector<double> &restrict node_distances, /* indexed by terminal_index */
    std::vector<double> &restrict node_depths, /* indexed by terminal_index */
    size_t curr_depth,
    const std::vector<Node> &tree
)
{
    if (end > st)
    {
        size_t i, j;
        for (size_t el1 = st; el1 < end; el1++)
        {
            for (size_t el2 = el1 + 1; el2 <= end; el2++)
            {
                i = node_mappings[node_indices[el1]];
                j = node_mappings[node_indices[el2]];
                node_distances[ix_comb(i, j, n_terminal, ncomb)]++;
            }
        }
    }

    if (!is_terminal_node(tree[curr_node]))
    {
        const size_t delim = get_idx_tree_right(tree[curr_node]);
        size_t frontier = st;
        size_t temp;
        for (size_t ix = st; ix <= end; ix++)
        {
           if (node_indices[ix] < delim)
            {
                temp = node_indices[frontier];
                node_indices[frontier] = node_indices[ix];
                node_indices[ix] = temp;
                frontier++;
            }
        }

        if (unlikely(frontier == st)) unexpected_error();

        curr_depth++;
        build_dindex_recursive<Node>(get_idx_tree_left(tree[curr_node]),
                                     n_terminal, ncomb,
                                     st, frontier-1,
                                     node_indices,
                                     node_mappings,
                                     node_distances,
                                     node_depths,
                                     curr_depth,
                                     tree);
        build_dindex_recursive<Node>(get_idx_tree_right(tree[curr_node]),
                                     n_terminal, ncomb,
                                     frontier, end,
                                     node_indices,
                                     node_mappings,
                                     node_distances,
                                     node_depths,
                                     curr_depth,
                                     tree);
    }

    else
    {
        node_depths[node_mappings[curr_node]] = curr_depth;
    }
}